

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes-ni.c
# Opt level: O3

void aes128_ni_sdctr(ssh_cipher *ciph,void *vblk,int blklen)

{
  undefined1 auVar1 [16];
  undefined1 (*pauVar2) [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  long lVar5;
  
  auVar1 = _DAT_00184830;
  if (0 < blklen) {
    pauVar2 = (undefined1 (*) [16])((long)blklen + (long)vblk);
    auVar4 = *(undefined1 (*) [16])(ciph + -3);
    auVar3 = pmovsxbq(in_XMM1,1);
    do {
      auVar4 = pshufb(auVar4,auVar1);
      auVar4 = aesenc(auVar4 ^ *(undefined1 (*) [16])(ciph + -0x3f),
                      *(undefined1 (*) [16])(ciph + -0x3d));
      auVar4 = aesenc(auVar4,*(undefined1 (*) [16])(ciph + -0x3b));
      auVar4 = aesenc(auVar4,*(undefined1 (*) [16])(ciph + -0x39));
      auVar4 = aesenc(auVar4,*(undefined1 (*) [16])(ciph + -0x37));
      auVar4 = aesenc(auVar4,*(undefined1 (*) [16])(ciph + -0x35));
      auVar4 = aesenc(auVar4,*(undefined1 (*) [16])(ciph + -0x33));
      auVar4 = aesenc(auVar4,*(undefined1 (*) [16])(ciph + -0x31));
      auVar4 = aesenc(auVar4,*(undefined1 (*) [16])(ciph + -0x2f));
      auVar4 = aesenc(auVar4,*(undefined1 (*) [16])(ciph + -0x2d));
      auVar4 = aesenclast(auVar4,*(undefined1 (*) [16])(ciph + -0x2b));
      *(undefined1 (*) [16])vblk = *vblk ^ auVar4;
      lVar5 = (long)&(ciph[-3].vt)->new + auVar3._0_8_;
      auVar4._8_8_ = (long)ciph[-2].vt + (auVar3._8_8_ - ((long)-(ulong)(lVar5 == 0) >> 0x3f));
      auVar4._0_8_ = lVar5;
      *(undefined1 (*) [16])(ciph + -3) = auVar4;
      vblk = (void *)((long)vblk + 0x10);
    } while (vblk < pauVar2);
  }
  return;
}

Assistant:

static inline void aes_sdctr_ni(
    ssh_cipher *ciph, void *vblk, int blklen, aes_ni_fn encrypt)
{
    aes_ni_context *ctx = container_of(ciph, aes_ni_context, ciph);

    for (uint8_t *blk = (uint8_t *)vblk, *finish = blk + blklen;
         blk < finish; blk += 16) {
        __m128i counter = aes_ni_sdctr_reverse(ctx->iv);
        __m128i keystream = encrypt(counter, ctx->keysched_e);
        __m128i input = _mm_loadu_si128((const __m128i *)blk);
        __m128i output = _mm_xor_si128(input, keystream);
        _mm_storeu_si128((__m128i *)blk, output);
        ctx->iv = aes_ni_sdctr_increment(ctx->iv);
    }
}